

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HFactor.cpp
# Opt level: O0

void __thiscall HFactor::zeroCol(HFactor *this,HighsInt jCol)

{
  int iVar1;
  int iVar2;
  int iVar3;
  reference pvVar4;
  int in_ESI;
  long in_RDI;
  vector<double,_std::allocator<double>_> *this_00;
  undefined8 extraout_XMM0_Qa;
  HighsInt original_row_count;
  HighsInt iRow;
  double abs_value;
  HighsInt iEl;
  HighsInt a_end;
  HighsInt a_start;
  HighsInt a_count;
  undefined8 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe0;
  
  pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x288),(long)in_ESI);
  iVar2 = *pvVar4;
  pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x270),(long)in_ESI);
  iVar3 = *pvVar4;
  iVar2 = iVar3 + iVar2;
  for (; iVar3 < iVar2; iVar3 = iVar3 + 1) {
    this_00 = (vector<double,_std::allocator<double>_> *)(in_RDI + 0x2e8);
    std::vector<double,_std::allocator<double>_>::operator[](this_00,(long)iVar3);
    std::abs((int)this_00);
    in_stack_ffffffffffffffd8 = extraout_XMM0_Qa;
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x2d0),(long)iVar3);
    iVar1 = *pvVar4;
    std::vector<int,_std::allocator<int>_>::operator[]
              ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x330),(long)iVar1);
    rowDelete((HFactor *)CONCAT44(iVar3,in_stack_ffffffffffffffe0),
              (HighsInt)((ulong)in_stack_ffffffffffffffd8 >> 0x20),
              (HighsInt)in_stack_ffffffffffffffd8);
    rlinkDel((HFactor *)CONCAT44(iVar3,in_stack_ffffffffffffffe0),
             (HighsInt)((ulong)in_stack_ffffffffffffffd8 >> 0x20));
    std::vector<int,_std::allocator<int>_>::operator[]
              ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x330),(long)iVar1);
    rlinkAdd((HFactor *)CONCAT44(iVar3,in_stack_ffffffffffffffe0),
             (HighsInt)((ulong)in_stack_ffffffffffffffd8 >> 0x20),
             (HighsInt)in_stack_ffffffffffffffd8);
  }
  clinkDel((HFactor *)CONCAT44(iVar3,in_stack_ffffffffffffffe0),
           (HighsInt)((ulong)in_stack_ffffffffffffffd8 >> 0x20));
  pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x288),(long)in_ESI);
  *pvVar4 = 0;
  pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x2a0),(long)in_ESI);
  *pvVar4 = 0;
  return;
}

Assistant:

void HFactor::zeroCol(const HighsInt jCol) {
  const HighsInt a_count = mc_count_a[jCol];
  const HighsInt a_start = mc_start[jCol];
  const HighsInt a_end = a_start + a_count;
  for (HighsInt iEl = a_start; iEl < a_end; iEl++) {
    const double abs_value = std::abs(mc_value[iEl]);
    const HighsInt iRow = mc_index[iEl];
    const HighsInt original_row_count = mr_count[iRow];
    // Remove the column index from this row of the row-wise
    // matrix. Also decreases the row count
    rowDelete(jCol, iRow);
    // Remove this row from the linked list of rows containing it
    rlinkDel(iRow);
    // Add the this row to the linked list of rows with this reduced
    // count
    assert(mr_count[iRow] == original_row_count - 1);
    rlinkAdd(iRow, mr_count[iRow]);
    assert(abs_value < pivot_tolerance);
  }
  // Remove the column from the linked list of columns containing it
  clinkDel(jCol);
  // Zero the counts of the active and inactive sections of the column
  mc_count_a[jCol] = 0;
  mc_count_n[jCol] = 0;
}